

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v6::detail::bigint::square(bigint *this)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  _func_int **in_stack_ffffffffffffff28;
  uint *in_stack_ffffffffffffff30;
  uint local_b8 [34];
  
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            ((basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *)
             &stack0xffffffffffffff28,&this->bigits_);
  uVar10 = (uint)(this->bigits_).super_buffer<unsigned_int>.size_;
  if ((int)uVar10 < 0) {
    assert_fail((char *)in_stack_ffffffffffffff30,0,(char *)in_stack_ffffffffffffff28);
  }
  uVar2 = (ulong)(uVar10 * 2);
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar2) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar2);
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar2;
  if (uVar10 == 0) {
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar8 = 0;
    uVar2 = 0;
    uVar3 = 0;
    puVar6 = in_stack_ffffffffffffff30;
    uVar4 = uVar8;
    do {
      do {
        bVar11 = CARRY8(uVar2,(ulong)in_stack_ffffffffffffff30[uVar8] * (ulong)*puVar6);
        uVar2 = uVar2 + (ulong)in_stack_ffffffffffffff30[uVar8] * (ulong)*puVar6;
        uVar3 = uVar3 + bVar11;
        bVar11 = uVar8 != 0;
        uVar8 = uVar8 - 1;
        puVar6 = puVar6 + 1;
      } while (bVar11);
      puVar1[uVar4] = (uint)uVar2;
      uVar2 = uVar2 >> 0x20 | uVar3 << 0x20;
      uVar3 = uVar3 >> 0x20;
      uVar8 = uVar4 + 1;
      puVar6 = in_stack_ffffffffffffff30;
      uVar4 = uVar8;
    } while (uVar8 != (uVar10 & 0x7fffffff));
  }
  if ((int)uVar10 < (int)(uVar10 * 2)) {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    iVar5 = -uVar10;
    uVar4 = (ulong)(uVar10 & 0x7fffffff);
    uVar7 = 1;
    do {
      if ((int)(((int)uVar4 - uVar10) + 1) < (int)uVar10) {
        puVar6 = in_stack_ffffffffffffff30 + (int)uVar7;
        lVar9 = -1;
        do {
          bVar11 = CARRY8(uVar2,(ulong)in_stack_ffffffffffffff30
                                       [(ulong)(uVar10 & 0x7fffffff) + lVar9] * (ulong)*puVar6);
          uVar2 = uVar2 + (ulong)in_stack_ffffffffffffff30[(ulong)(uVar10 & 0x7fffffff) + lVar9] *
                          (ulong)*puVar6;
          uVar3 = uVar3 + bVar11;
          lVar9 = lVar9 + -1;
          puVar6 = puVar6 + 1;
        } while (iVar5 != (int)lVar9);
      }
      puVar1[uVar4] = (uint)uVar2;
      uVar2 = uVar2 >> 0x20 | uVar3 << 0x20;
      uVar3 = uVar3 >> 0x20;
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 1;
      bVar11 = uVar7 != uVar10;
      uVar7 = uVar7 + 1;
    } while (bVar11);
  }
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  if (in_stack_ffffffffffffff30 != local_b8) {
    operator_delete(in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void square() {
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    bigits_.resize(to_unsigned(num_result_bigits));
    using accumulator_t = conditional_t<FMT_USE_INT128, uint128_t, accumulator>;
    auto sum = accumulator_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;
    }
    --num_result_bigits;
    remove_leading_zeros();
    exp_ *= 2;
  }